

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.cpp
# Opt level: O0

string * __thiscall
libtorrent::gzip_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,gzip_error_category *this,int ev)

{
  char *__s;
  long lVar1;
  value_type *ppcVar2;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  int local_1c;
  gzip_error_category *pgStack_18;
  int ev_local;
  gzip_error_category *this_local;
  
  local_1c = ev;
  pgStack_18 = this;
  this_local = (gzip_error_category *)__return_storage_ptr__;
  if ((-1 < ev) &&
     (lVar1 = libtorrent::aux::
              container_wrapper<const_char_*,_long,_std::array<const_char_*,_16UL>_>::end_index
                        (&message::msgs), ev < lVar1)) {
    ppcVar2 = libtorrent::aux::
              container_wrapper<const_char_*,_long,_std::array<const_char_*,_16UL>_>::operator[]
                        (&message::msgs,(long)local_1c);
    __s = *ppcVar2;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_2d);
    ::std::allocator<char>::~allocator(local_2d);
    return __return_storage_ptr__;
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Unknown error",&local_1d);
  ::std::allocator<char>::~allocator(&local_1d);
  return __return_storage_ptr__;
}

Assistant:

std::string gzip_error_category::message(int ev) const
	{
		static aux::array<char const*, 16> msgs{
		{
			"no error",
			"invalid gzip header",
			"inflated data too large",
			"available inflate data did not terminate",
			"output space exhausted before completing inflate",
			"invalid block type (type == 3)",
			"stored block length did not match one's complement",
			"dynamic block code description: too many length or distance codes",
			"dynamic block code description: code lengths codes incomplete",
			"dynamic block code description: repeat lengths with no first length",
			"dynamic block code description: repeat more than specified lengths",
			"dynamic block code description: invalid literal/length code lengths",
			"dynamic block code description: invalid distance code lengths",
			"invalid literal/length or distance code in fixed or dynamic block",
			"distance is too far back in fixed or dynamic block",
			"unknown gzip error",
		}};
		if (ev < 0 || ev >= msgs.end_index())
			return "Unknown error";
		return msgs[ev];
	}